

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QObjectPrivate::setParent_helper(QObjectPrivate *this,QObject *o)

{
  QObject **this_00;
  long lVar1;
  QObject *pQVar2;
  QObject *child;
  QObjectData *pQVar3;
  long lVar4;
  long lVar5;
  pointer ppQVar6;
  long lVar7;
  uint uVar8;
  long unaff_R13;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  QObject *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QObjectData).parent;
  if (pQVar2 == o) goto LAB_002b4b1b;
  child = (this->super_QObjectData).q_ptr;
  this_00 = &(this->super_QObjectData).parent;
  if (pQVar2 != (QObject *)0x0) {
    pQVar3 = (pQVar2->d_ptr).d;
    if ((((*(uint *)&pQVar3->field_0x30 & 8) == 0) ||
        (((this->super_QObjectData).field_0x30 & 4) == 0)) ||
       ((QObject *)pQVar3[1].children.d.d != child)) {
      lVar4 = (pQVar3->children).d.size;
      if (lVar4 == 0) {
LAB_002b4993:
        uVar8 = 0xffffffff;
      }
      else {
        lVar7 = -8;
        do {
          uVar8 = (uint)unaff_R13;
          lVar1 = lVar4 * -8 + lVar7;
          if (lVar1 == -8) goto LAB_002b498d;
          unaff_R13 = lVar7 + 8;
          lVar5 = lVar7 + 8;
          lVar7 = unaff_R13;
        } while (*(QObject **)((long)(pQVar3->children).d.ptr + lVar5) != child);
        uVar8 = (uint)(unaff_R13 >> 3);
LAB_002b498d:
        if (lVar1 == -8) goto LAB_002b4993;
      }
      if (-1 < (int)uVar8) {
        if ((*(uint *)&pQVar3->field_0x30 & 8) == 0) {
          QList<QObject_*>::removeAt(&pQVar3->children,(ulong)(uVar8 & 0x7fffffff));
          if ((((this->super_QObjectData).field_0x30 & 0x10) != 0) &&
             ((pQVar3->field_0x30 & 0x20) != 0)) {
            local_48 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QChildEvent::QChildEvent((QChildEvent *)local_58,ChildRemoved,child);
            QCoreApplication::sendEvent(*this_00,(QEvent *)local_58);
            QTimerEvent::~QTimerEvent((QTimerEvent *)local_58);
          }
        }
        else {
          ppQVar6 = QList<QObject_*>::data(&pQVar3->children);
          ppQVar6[uVar8 & 0x7fffffff] = (QObject *)0x0;
        }
      }
    }
  }
  if (((this->super_QObjectData).field_0x31 & 8) != 0) {
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)local_58,ParentAboutToChange);
    QCoreApplication::sendEvent(child,(QEvent *)local_58);
    QTimerEvent::~QTimerEvent((QTimerEvent *)local_58);
  }
  *this_00 = o;
  if (o != (QObject *)0x0) {
    pQVar3 = (o->d_ptr).d;
    if ((this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p !=
        (__pointer_type)pQVar3[1].q_ptr) {
      setParent_helper((QObjectPrivate *)this_00);
      goto LAB_002b4b1b;
    }
    local_58._0_8_ = child;
    QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
              ((QPodArrayOps<QObject*> *)&pQVar3->children,(pQVar3->children).d.size,
               (QObject **)local_58);
    QList<QObject_*>::end(&pQVar3->children);
    uVar8 = *(uint *)&(this->super_QObjectData).field_0x30;
    if ((((uVar8 & 0x10) != 0) && ((uVar8 & 1) == 0)) &&
       ((*(uint *)&(((*this_00)->d_ptr).d)->field_0x30 & 0x20) != 0)) {
      local_48 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QChildEvent::QChildEvent((QChildEvent *)local_58,ChildAdded,child);
      QCoreApplication::sendEvent(*this_00,(QEvent *)local_58);
      QTimerEvent::~QTimerEvent((QTimerEvent *)local_58);
    }
  }
  if (((this->super_QObjectData).field_0x31 & 8) != 0) {
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)local_58,ParentChange);
    QCoreApplication::sendEvent(child,(QEvent *)local_58);
    QTimerEvent::~QTimerEvent((QTimerEvent *)local_58);
  }
LAB_002b4b1b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObjectPrivate::setParent_helper(QObject *o)
{
    Q_Q(QObject);
    Q_ASSERT_X(q != o, Q_FUNC_INFO, "Cannot parent a QObject to itself");
#ifdef QT_DEBUG
    const auto checkForParentChildLoops = qScopeGuard([&](){
        int depth = 0;
        auto p = parent;
        while (p) {
            if (++depth == CheckForParentChildLoopsWarnDepth) {
                qWarning("QObject %p (class: '%s', object name: '%s') may have a loop in its parent-child chain; "
                         "this is undefined behavior",
                         q, q->metaObject()->className(), qPrintable(q->objectName()));
            }
            p = p->parent();
        }
    });
#endif

    if (o == parent)
        return;

    if (parent) {
        QObjectPrivate *parentD = parent->d_func();
        if (parentD->isDeletingChildren && wasDeleted
            && parentD->currentChildBeingDeleted == q) {
            // don't do anything since QObjectPrivate::deleteChildren() already
            // cleared our entry in parentD->children.
        } else {
            const int index = parentD->children.indexOf(q);
            if (index < 0) {
                // we're probably recursing into setParent() from a ChildRemoved event, don't do anything
            } else if (parentD->isDeletingChildren) {
                parentD->children[index] = nullptr;
            } else {
                parentD->children.removeAt(index);
                if (sendChildEvents && parentD->receiveChildEvents) {
                    QChildEvent e(QEvent::ChildRemoved, q);
                    QCoreApplication::sendEvent(parent, &e);
                }
            }
        }
    }

    if (receiveParentEvents) {
        Q_ASSERT(!isWidget); // Handled in QWidget
        QEvent e(QEvent::ParentAboutToChange);
        QCoreApplication::sendEvent(q, &e);
    }

    parent = o;

    if (parent) {
        // object hierarchies are constrained to a single thread
        if (threadData.loadRelaxed() != parent->d_func()->threadData.loadRelaxed()) {
            qWarning("QObject::setParent: Cannot set parent, new parent is in a different thread");
            parent = nullptr;
            return;
        }
        parent->d_func()->children.append(q);
        if (sendChildEvents && parent->d_func()->receiveChildEvents) {
            if (!isWidget) {
                QChildEvent e(QEvent::ChildAdded, q);
                QCoreApplication::sendEvent(parent, &e);
            }
        }
    }

    if (receiveParentEvents) {
        Q_ASSERT(!isWidget); // Handled in QWidget
        QEvent e(QEvent::ParentChange);
        QCoreApplication::sendEvent(q, &e);
    }
}